

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall ParserProbModelXML::InitializeLRFs(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  FactoredDecPOMDPDiscrete *this_00;
  xmlXPathObjectPtr pxVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  EParse *this_01;
  long lVar5;
  char *this_02;
  string name;
  
  this_02 = "/ProbModelXML/ProbNet/Variables/Variable[@role=\'utility\']";
  pxVar2 = GetNodesMatchingExpression
                     (this,(xmlChar *)"/ProbModelXML/ProbNet/Variables/Variable[@role=\'utility\']",
                      (xmlNodePtr)0x0);
  if (pxVar2 != (xmlXPathObjectPtr)0x0) {
    pxVar1 = pxVar2->nodesetval;
    for (lVar5 = 0; sVar3 = (size_t)pxVar1->nodeNr, lVar5 < (long)sVar3; lVar5 = lVar5 + 1) {
      GetVariableName_abi_cxx11_(&name,(ParserProbModelXML *)this_02,pxVar1->nodeTab[lVar5]);
      this_02 = (char *)&name;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
               ::operator[](&this->_m_parsedElements,(key_type *)&name);
      pmVar4->first = REWARD;
      pmVar4->second = (uint)lVar5;
      std::__cxx11::string::~string((string *)&name);
    }
    this_00 = this->_m_fDecPOMDP;
    this_00->_m_nrLRFs = sVar3;
    FactoredDecPOMDPDiscrete::InitializeStorage(this_00);
    xmlXPathFreeObject(pxVar2);
    return;
  }
  this_01 = (EParse *)__cxa_allocate_exception(0x28);
  EParse::EParse(this_01,"No reward variables found in the model.");
  __cxa_throw(this_01,&EParse::typeinfo,E::~E);
}

Assistant:

void ParserProbModelXML::InitializeLRFs()
{
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Variables/Variable[@role='utility']";
    xmlXPathObjectPtr reward_nodes = GetNodesMatchingExpression(xpath);

    if(reward_nodes == NULL){
        throw EParse("No reward variables found in the model.");
    }

    xmlNodeSetPtr reward_nodeset = reward_nodes->nodesetval;
    for(int i = 0; i < reward_nodeset->nodeNr; i++)
    {
        string name = GetVariableName(reward_nodeset->nodeTab[i]);
        pair<elm_type, Index> element = make_pair(REWARD, i);
        _m_parsedElements[name] = element;
    }

    _m_fDecPOMDP->SetNrLRFs(reward_nodeset->nodeNr);

    xmlXPathFreeObject (reward_nodes);
}